

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O2

RecyclableObject *
TTD::NSSnapObjects::DoObjectInflation_SnapPromiseReactionTaskFunctionInfo
          (SnapObject *snpObject,InflateMap *inflator)

{
  SnapPromiseReactionTaskFunctionInfo *pSVar1;
  ScriptContext *ctx;
  JavascriptPromiseReaction *reaction;
  Var argument;
  RecyclableObject *pRVar2;
  
  pSVar1 = SnapObjectGetAddtlInfoAs<TTD::NSSnapObjects::SnapPromiseReactionTaskFunctionInfo*,(TTD::NSSnapObjects::SnapObjectType)30>
                     (snpObject);
  ctx = InflateMap::LookupScriptContext(inflator,snpObject->SnapType->ScriptContextLogId);
  reaction = NSSnapValues::InflatePromiseReactionInfo(&pSVar1->Reaction,ctx,inflator);
  argument = InflateMap::InflateTTDVar(inflator,pSVar1->Argument);
  pRVar2 = Js::JavascriptLibrary::CreatePromiseReactionTaskFunction_TTD
                     ((ctx->super_ScriptContextBase).javascriptLibrary,reaction,argument);
  return pRVar2;
}

Assistant:

Js::RecyclableObject* DoObjectInflation_SnapPromiseReactionTaskFunctionInfo(const SnapObject* snpObject, InflateMap* inflator)
        {
            const SnapPromiseReactionTaskFunctionInfo* rInfo = SnapObjectGetAddtlInfoAs<SnapPromiseReactionTaskFunctionInfo*, SnapObjectType::SnapPromiseReactionTaskFunctionObject>(snpObject);
            Js::ScriptContext* ctx = inflator->LookupScriptContext(snpObject->SnapType->ScriptContextLogId);

            Js::JavascriptPromiseReaction* reaction = NSSnapValues::InflatePromiseReactionInfo(&rInfo->Reaction, ctx, inflator);
            Js::Var argument = inflator->InflateTTDVar(rInfo->Argument);

            return ctx->GetLibrary()->CreatePromiseReactionTaskFunction_TTD(reaction, argument);
        }